

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diagnostics.h
# Opt level: O3

type __thiscall
fmt::v5::formatter<flow::diagnostics::Type,char,void>::
format<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
          (formatter<flow::diagnostics::Type,char,void> *this,Type *v,
          basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
          *ctx)

{
  basic_buffer<char> *pbVar1;
  unsigned_long_long uVar2;
  size_t sVar3;
  basic_buffer<char> *container;
  char *pcVar4;
  basic_string_view<char> format_str;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  ulong local_48 [3];
  undefined **local_30;
  char *local_28;
  size_t local_20;
  size_t local_18;
  basic_buffer<char> *local_10;
  
  local_48[0] = (ulong)*v;
  pbVar1 = (ctx->
           super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
           ).out_.container;
  switch(local_48[0]) {
  case 0:
    local_28 = pbVar1->ptr_;
    local_18 = pbVar1->size_;
    pcVar4 = "TokenError";
    sVar3 = 10;
    break;
  case 1:
    local_28 = pbVar1->ptr_;
    local_18 = pbVar1->size_;
    pcVar4 = "SyntaxError";
    sVar3 = 0xb;
    break;
  case 2:
    local_28 = pbVar1->ptr_;
    local_18 = pbVar1->size_;
    pcVar4 = "TypeError";
    goto LAB_0013565d;
  case 3:
    local_28 = pbVar1->ptr_;
    local_18 = pbVar1->size_;
    pcVar4 = "Warning";
    sVar3 = 7;
    break;
  case 4:
    local_28 = pbVar1->ptr_;
    local_18 = pbVar1->size_;
    pcVar4 = "LinkError";
LAB_0013565d:
    sVar3 = 9;
    break;
  default:
    local_28 = pbVar1->ptr_;
    local_18 = pbVar1->size_;
    pcVar4 = "{}";
    sVar3 = 2;
    uVar2 = 3;
    goto LAB_001356e2;
  }
  local_48[0] = 0;
  uVar2 = 0;
LAB_001356e2:
  local_30 = &PTR_grow_00193578;
  format_str.size_ = sVar3;
  format_str.data_ = pcVar4;
  args.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)local_48;
  args.types_ = uVar2;
  local_20 = local_18;
  local_10 = pbVar1;
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_30,format_str,args);
  return (type)pbVar1;
}

Assistant:

constexpr auto format(const Type& v, FormatContext &ctx) {
      switch (v) {
        case Type::TokenError:
          return format_to(ctx.begin(), "TokenError");
        case Type::SyntaxError:
          return format_to(ctx.begin(), "SyntaxError");
        case Type::TypeError:
          return format_to(ctx.begin(), "TypeError");
        case Type::Warning:
          return format_to(ctx.begin(), "Warning");
        case Type::LinkError:
          return format_to(ctx.begin(), "LinkError");
        default:
          return format_to(ctx.begin(), "{}", static_cast<unsigned>(v));
      }
    }